

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_io.c
# Opt level: O2

Qiniu_Error Qiniu_File_Open(Qiniu_File **pp,char *file)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  Qiniu_Error QVar5;
  
  iVar2 = open(file,0,0x1a4);
  pcVar4 = Qiniu_OK.message;
  uVar1 = Qiniu_OK.code;
  if (iVar2 == -1) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    pcVar4 = "open file failed";
  }
  else {
    *pp = (Qiniu_File *)(long)iVar2;
  }
  QVar5._4_4_ = 0;
  QVar5.code = uVar1;
  QVar5.message = pcVar4;
  return QVar5;
}

Assistant:

Qiniu_Error Qiniu_File_Open(Qiniu_File **pp, const char *file)
{
	Qiniu_Error err;
	Qiniu_Posix_Handle fd = Qiniu_Posix_Open(file, O_BINARY | O_RDONLY, 0644);
	if (fd != Qiniu_Posix_InvalidHandle)
	{
		err = Qiniu_OK;
		*pp = (Qiniu_File *)(size_t)fd;
	}
	else
	{
		err.code = errno;
		err.message = "open file failed";
	}
	return err;
}